

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

bool __thiscall r_comp::Preprocessor::isTemplateClass(Preprocessor *this,Ptr *replistruct)

{
  Type TVar1;
  element_type *peVar2;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Ptr childstruct;
  string type;
  string name;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_98;
  Preprocessor *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  peVar2 = (replistruct->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var5 = &((peVar2->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  p_Var3 = &((peVar2->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  local_88 = this;
  do {
    if (p_Var5 == p_Var3) {
LAB_00140f3e:
      return p_Var5 != p_Var3;
    }
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,p_Var5);
    local_60 = local_50;
    local_58 = 0;
    local_50[0] = 0;
    local_80 = local_70;
    local_78 = 0;
    local_70[0] = 0;
    TVar1 = (local_98._M_ptr)->type;
    if ((TVar1 - Structure < 2) || (TVar1 == Development)) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&local_98);
      bVar4 = isTemplateClass(local_88,(Ptr *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      if (bVar4) goto LAB_00140f20;
    }
    else if ((TVar1 == Atom) && (bVar4 = std::operator==(&(local_98._M_ptr)->cmd,":~"), bVar4)) {
LAB_00140f20:
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      goto LAB_00140f3e;
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    p_Var5 = p_Var5 + 1;
  } while( true );
}

Assistant:

bool Preprocessor::isTemplateClass(RepliStruct::Ptr replistruct)
{
    for (RepliStruct::Ptr childstruct : replistruct->args) {
        std::string name;
        std::string type;

        switch (childstruct->type) {
        case RepliStruct::Atom:
            if (childstruct->cmd == ":~") {
                return true;
            }

            break;

        case RepliStruct::Structure: // template instantiation; args are the actual parameters.
        case RepliStruct::Development: // actual template arg as a list of args.
        case RepliStruct::Set: // sets can contain tpl args.
            if (isTemplateClass(childstruct)) {
                return true;
            }

            break;

        default:
            break;
        }
    }

    return false;
}